

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * __thiscall
fmt::v10::detail::format_string_checker<char,_void_*,_int>::on_format_specs
          (format_string_checker<char,_void_*,_int> *this,int id,char *begin,char *param_3)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = (long)begin - *(long *)(this + 8);
  if (lVar2 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                ,0x189,"negative value");
  }
  *(long *)(this + 8) = *(long *)(this + 8) + lVar2;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) - lVar2;
  if ((uint)id < 2) {
    pcVar1 = (char *)(**(code **)(this + (ulong)(uint)id * 8 + 0x28))(this + 8);
    return pcVar1;
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char*)
      -> const Char* {
    context_.advance_to(begin);
    // id >= 0 check is a workaround for gcc 10 bug (#2065).
    return id >= 0 && id < num_args ? parse_funcs_[id](context_) : begin;
  }